

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
__thiscall
SafeInt<signed_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
operator>>(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
           *this,SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                 bits)

{
  char cVar1;
  byte bVar2;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *in_RDI;
  char local_11 [16];
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_1;
  
  cVar1 = ::SafeInt::operator_cast_to_char(in_RDI);
  if (cVar1 < '\0') {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x179f,
                  "SafeInt<T, E> SafeInt<signed char>::operator>>(SafeInt<U, E>) const [T = signed char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = char]"
                 );
  }
  cVar1 = ::SafeInt::operator_cast_to_char(in_RDI);
  if (cVar1 < '\b') {
    cVar1 = in_RDI->m_int;
    bVar2 = ::SafeInt::operator_cast_to_char(in_RDI);
    local_11[0] = (char)((int)cVar1 >> (bVar2 & 0x1f));
    SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_1,local_11);
    return (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            )local_1.m_int;
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17a0,
                "SafeInt<T, E> SafeInt<signed char>::operator>>(SafeInt<U, E>) const [T = signed char, E = safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>, U = char]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator >>( SafeInt< U, E > bits ) const SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        return SafeInt< T, E >( (T)(m_int >> (U)bits) );
    }